

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall cppcms::application::translate_abi_cxx11_(application *this,char *message)

{
  basic_message<char> *in_RDI;
  char *in_stack_ffffffffffffff28;
  basic_message<char> *this_00;
  locale local_a0 [24];
  application *in_stack_ffffffffffffff78;
  
  this_00 = in_RDI;
  booster::locale::translate<char>(in_stack_ffffffffffffff28);
  context(in_stack_ffffffffffffff78);
  http::context::locale((context *)this_00);
  booster::locale::basic_message<char>::str_abi_cxx11_(this_00,(locale *)in_RDI);
  std::locale::~locale(local_a0);
  booster::locale::basic_message<char>::~basic_message(in_RDI);
  return (string *)this_00;
}

Assistant:

std::string application::translate(char const *message)
{
	return booster::locale::translate(message).str(context().locale());
}